

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

void Buf_ManStop(Buf_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *pVVar2;
  Vec_Que_t *__ptr_00;
  Vec_Flt_t *__ptr_01;
  
  printf("Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ",(ulong)(uint)p->nSeparate,
         (ulong)(uint)p->nDuplicate,(ulong)(uint)p->nBranch0,(ulong)(uint)p->nBranch1,
         (ulong)(uint)p->nBranchCrit);
  iVar1 = p->pNtk->vObjs->nSize;
  printf("Orig = %d. Add = %d. Rem = %d.\n",(ulong)(uint)p->nObjStart,
         (ulong)(uint)(iVar1 - p->nObjStart),(ulong)(uint)(p->nObjAlloc - iVar1));
  __ptr = p->vFanouts;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  pVVar2 = p->vTfCone;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vNonCrit;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vDelays;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOrder;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vOffsets;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vEdges;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vArr;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vDep;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  __ptr_00 = p->vQue;
  if (__ptr_00->pOrder != (int *)0x0) {
    free(__ptr_00->pOrder);
    __ptr_00->pOrder = (int *)0x0;
  }
  if (__ptr_00->pHeap != (int *)0x0) {
    free(__ptr_00->pHeap);
    __ptr_00->pHeap = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Que_t *)0x0) {
    free(__ptr_00);
  }
  __ptr_01 = p->vCounts;
  if (__ptr_01->pArray != (float *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (float *)0x0;
  }
  if (__ptr_01 != (Vec_Flt_t *)0x0) {
    free(__ptr_01);
  }
  if (p != (Buf_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Buf_ManStop( Buf_Man_t * p )
{
    printf( "Sep = %d. Dup = %d. Br0 = %d. Br1 = %d. BrC = %d.  ", 
        p->nSeparate, p->nDuplicate, p->nBranch0, p->nBranch1, p->nBranchCrit );
    printf( "Orig = %d. Add = %d. Rem = %d.\n", 
        p->nObjStart, Abc_NtkObjNumMax(p->pNtk) - p->nObjStart, 
        p->nObjAlloc - Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrFree( p->vFanouts );
    Vec_IntFree( p->vTfCone );
    Vec_IntFree( p->vNonCrit );
    Vec_IntFree( p->vDelays );
    Vec_IntFree( p->vOrder );
    Vec_IntFree( p->vOffsets );
    Vec_IntFree( p->vEdges );
    Vec_IntFree( p->vArr );
    Vec_IntFree( p->vDep );
//    Vec_QueCheck( p->vQue );
    Vec_QueFree( p->vQue );
    Vec_FltFree( p->vCounts );
    ABC_FREE( p );
}